

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.cc
# Opt level: O1

int EVP_DecodeBlock(uchar *t,uchar *f,int n)

{
  uint8_t *puVar1;
  int iVar2;
  ulong in_RAX;
  undefined4 in_register_00000014;
  size_t in_len;
  ulong uVar3;
  ulong local_18;
  
  in_len = CONCAT44(in_register_00000014,n);
  if (in_len != 0) {
    puVar1 = f + in_len;
    do {
      if ((*f != ' ') && (*f != '\t')) goto LAB_0027c7bb;
      f = f + 1;
      in_len = in_len - 1;
    } while (in_len != 0);
    in_len = 0;
    f = puVar1;
  }
LAB_0027c7bb:
  if (in_len != 0) {
    do {
      if ((0x20 < (ulong)f[in_len - 1]) ||
         ((0x100002600U >> ((ulong)f[in_len - 1] & 0x3f) & 1) == 0)) goto LAB_0027c7e4;
      in_len = in_len - 1;
    } while (in_len != 0);
    in_len = 0;
  }
LAB_0027c7e4:
  local_18 = in_RAX;
  if ((in_len & 3) == 0) {
    local_18 = (in_len >> 2) * 3;
  }
  uVar3 = 0xffffffff;
  if ((local_18 < 0x80000000 && (in_len & 3) == 0) &&
     (iVar2 = EVP_DecodeBase64(t,&local_18,local_18,f,in_len), iVar2 != 0)) {
    if (0x5555555555555555 < local_18 * -0x5555555555555555) {
      do {
        t[local_18] = '\0';
        local_18 = local_18 + 1;
      } while ((local_18 / 3) * 3 != local_18);
    }
    uVar3 = local_18;
    if ((local_18 & 0xffffffff80000000) != 0) {
      __assert_fail("dst_len <= INT_MAX",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/base64/base64.cc"
                    ,0x1af,"int EVP_DecodeBlock(uint8_t *, const uint8_t *, size_t)");
    }
  }
  return (int)uVar3;
}

Assistant:

int EVP_DecodeBlock(uint8_t *dst, const uint8_t *src, size_t src_len) {
  // Trim spaces and tabs from the beginning of the input.
  while (src_len > 0) {
    if (src[0] != ' ' && src[0] != '\t') {
      break;
    }

    src++;
    src_len--;
  }

  // Trim newlines, spaces and tabs from the end of the line.
  while (src_len > 0) {
    switch (src[src_len - 1]) {
      case ' ':
      case '\t':
      case '\r':
      case '\n':
        src_len--;
        continue;
    }

    break;
  }

  size_t dst_len;
  if (!EVP_DecodedLength(&dst_len, src_len) || dst_len > INT_MAX ||
      !EVP_DecodeBase64(dst, &dst_len, dst_len, src, src_len)) {
    return -1;
  }

  // EVP_DecodeBlock does not take padding into account, so put the
  // NULs back in... so the caller can strip them back out.
  while (dst_len % 3 != 0) {
    dst[dst_len++] = '\0';
  }
  assert(dst_len <= INT_MAX);

  return (int)dst_len;
}